

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

float * __thiscall llama_context::get_logits_ith(llama_context *this,int32_t i)

{
  float *pfVar1;
  pointer piVar2;
  ulong uVar3;
  int iVar4;
  uint32_t uVar5;
  runtime_error *prVar6;
  uint uVar7;
  string sStack_48;
  
  uVar3 = (ulong)(uint)i;
  pfVar1 = this->logits;
  if (pfVar1 == (float *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"no logits");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (i < 0) {
    iVar4 = this->n_outputs;
    uVar7 = iVar4 + i;
    if ((int)uVar7 < 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&sStack_48,"negative index out of range [0, %d)",
                        (ulong)(uint)this->n_outputs);
      std::runtime_error::runtime_error(prVar6,(string *)&sStack_48);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    piVar2 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&sStack_48,"out of range [0, %zu)",
                        (long)(this->output_ids).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->output_ids).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
      std::runtime_error::runtime_error(prVar6,(string *)&sStack_48);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar7 = piVar2[uVar3];
    if ((int)uVar7 < 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&sStack_48,"batch.logits[%d] != true",uVar3);
      std::runtime_error::runtime_error(prVar6,(string *)&sStack_48);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = this->n_outputs;
  }
  if ((int)uVar7 < iVar4) {
    uVar5 = llama_vocab::n_tokens(&this->model->vocab);
    return pfVar1 + uVar5 * uVar7;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_(&sStack_48,"corrupt output buffer (j=%d, n_outputs=%d)",(ulong)uVar7,
                    (ulong)(uint)this->n_outputs);
  std::runtime_error::runtime_error(prVar6,(string *)&sStack_48);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float * llama_context::get_logits_ith(int32_t i) {
    int32_t j = -1;

    try {
        if (logits == nullptr) {
            throw std::runtime_error("no logits");
        }

        if (i < 0) {
            j = n_outputs + i;
            if (j < 0) {
                throw std::runtime_error(format("negative index out of range [0, %d)", n_outputs));
            }
        } else if ((size_t) i >= output_ids.size()) {
            throw std::runtime_error(format("out of range [0, %zu)", output_ids.size()));
        } else {
            j = output_ids[i];
        }

        if (j < 0) {
            throw std::runtime_error(format("batch.logits[%d] != true", i));
        }
        if (j >= n_outputs) {
            // This should not happen
            throw std::runtime_error(format("corrupt output buffer (j=%d, n_outputs=%d)", j, n_outputs));
        }

        return logits + j*model.vocab.n_tokens();
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: invalid logits id %d, reason: %s\n", __func__, i, err.what());
#ifndef NDEBUG
        GGML_ABORT("fatal error");
#else
        return nullptr;
#endif
    }
}